

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

EVstone INT_REVcreate_bridge_action(CMConnection conn,attr_list contact_list,EVstone remote_stone)

{
  int condition;
  CMFormat format;
  EVcreate_bridge_action_request request;
  EV_int_response response;
  undefined8 local_48;
  void *pvStack_40;
  undefined8 local_38;
  undefined1 local_30 [4];
  EVstone local_2c;
  
  local_48 = 0;
  pvStack_40 = (void *)0x0;
  local_38 = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVcreate_bridge_action_req_formats);
  pvStack_40 = (void *)attr_list_to_string(contact_list);
  local_38 = CONCAT44(local_38._4_4_,remote_stone);
  local_48 = CONCAT44(local_48._4_4_,condition);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVcreate_bridge_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_30);
  INT_CMwrite(conn,format,&local_48);
  free(pvStack_40);
  INT_CMCondition_wait(conn->cm,condition);
  return local_2c;
}

Assistant:

extern EVstone
INT_REVcreate_bridge_action(CMConnection conn, attr_list contact_list, EVstone remote_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVcreate_bridge_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVcreate_bridge_action_req_formats);
    request.contact_list = attr_list_to_string(contact_list);
    request.remote_stone = remote_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVcreate_bridge_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    free(request.contact_list);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}